

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O2

cbtVector3 __thiscall cbtQuantizedBvh::unQuantize(cbtQuantizedBvh *this,unsigned_short *vecIn)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cbtVector3 cVar5;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)((this->m_bvhQuantization).m_floats + 1);
  uVar1 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 1);
  auVar2 = vpmovzxwd_avx(ZEXT416(*(uint *)(vecIn + 1)));
  auVar2 = vcvtdq2ps_avx(auVar2);
  auVar2 = vdivps_avx(auVar2,auVar4);
  auVar3._0_4_ = auVar2._0_4_ + (float)uVar1;
  auVar3._4_4_ = auVar2._4_4_ + (float)((ulong)uVar1 >> 0x20);
  auVar3._8_4_ = auVar2._8_4_ + 0.0;
  auVar3._12_4_ = auVar2._12_4_ + 0.0;
  auVar2 = vinsertps_avx(ZEXT416((uint)((float)*vecIn / (this->m_bvhQuantization).m_floats[0] +
                                       (this->m_bvhAabbMin).m_floats[0])),auVar3,0x1c);
  auVar3 = vinsertps_avx(auVar2,auVar3,0x4e);
  cVar5.m_floats._0_8_ = auVar2._0_8_;
  cVar5.m_floats._8_8_ = auVar3._0_8_;
  return (cbtVector3)cVar5.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtVector3 unQuantize(const unsigned short* vecIn) const
	{
		cbtVector3 vecOut;
		vecOut.setValue(
			(cbtScalar)(vecIn[0]) / (m_bvhQuantization.getX()),
			(cbtScalar)(vecIn[1]) / (m_bvhQuantization.getY()),
			(cbtScalar)(vecIn[2]) / (m_bvhQuantization.getZ()));
		vecOut += m_bvhAabbMin;
		return vecOut;
	}